

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  uint uVar1;
  int iVar2;
  Instruction i;
  
  switch(e->k) {
  case VLOCAL:
    e->k = VNONRELOC;
    return;
  case VUPVAL:
    i = (e->u).s.info << 0x17 | 4;
    break;
  case VGLOBAL:
    i = (e->u).s.info << 0xe | 5;
    break;
  case VINDEXED:
    uVar1 = (e->u).s.aux;
    if (((uVar1 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar1)) {
      fs->freereg = fs->freereg + -1;
    }
    uVar1 = (e->u).s.info;
    if (((uVar1 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar1)) {
      fs->freereg = fs->freereg + -1;
    }
    i = (e->u).s.aux << 0xe | (e->u).s.info << 0x17 | 6;
    break;
  default:
    goto switchD_0010d5f8_caseD_a;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
    return;
  }
  iVar2 = luaK_code(fs,i,fs->ls->lastline);
  (e->u).s.info = iVar2;
  e->k = VRELOCABLE;
switchD_0010d5f8_caseD_a:
  return;
}

Assistant:

static void luaK_dischargevars(FuncState*fs,expdesc*e){
switch(e->k){
case VLOCAL:{
e->k=VNONRELOC;
break;
}
case VUPVAL:{
e->u.s.info=luaK_codeABC(fs,OP_GETUPVAL,0,e->u.s.info,0);
e->k=VRELOCABLE;
break;
}
case VGLOBAL:{
e->u.s.info=luaK_codeABx(fs,OP_GETGLOBAL,0,e->u.s.info);
e->k=VRELOCABLE;
break;
}
case VINDEXED:{
freereg(fs,e->u.s.aux);
freereg(fs,e->u.s.info);
e->u.s.info=luaK_codeABC(fs,OP_GETTABLE,0,e->u.s.info,e->u.s.aux);
e->k=VRELOCABLE;
break;
}
case VVARARG:
case VCALL:{
luaK_setoneret(fs,e);
break;
}
default:break;
}
}